

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O1

bool __thiscall depspawn::internal::TaskPool::try_run(TaskPool *this)

{
  bool bVar1;
  bool bVar2;
  Task *p;
  Task *local_20;
  
  bVar1 = boost::lockfree::
          queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
          pop<depspawn::internal::TaskPool::Task*>(&this->hp_queue_,&local_20);
  bVar2 = true;
  if (!bVar1) {
    bVar2 = boost::lockfree::
            queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
            pop<depspawn::internal::TaskPool::Task*>(&this->queue_,&local_20);
  }
  if (bVar2 != false) {
    Task::run(local_20);
    LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::free
              (&this->task_pool_,local_20);
  }
  return bVar2;
}

Assistant:

bool try_run()
  { Task *p;

    const bool ret = hp_queue_.pop(p) || queue_.pop(p);
    if (ret) {
      run(p);
    }

    return ret;
  }